

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86.cpp
# Opt level: O3

int __thiscall
ncnn::Convolution_x86::forwardDilation
          (Convolution_x86 *this,Mat *bottom_blob,Mat *top_blob,conv_func conv,Option *opt)

{
  uint uVar1;
  int iVar2;
  size_t _elemsize;
  Allocator *pAVar3;
  size_t sVar4;
  size_t sVar5;
  int iVar6;
  ulong uVar7;
  void *pvVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  void *pvVar12;
  undefined4 *puVar13;
  ulong uVar14;
  int iVar15;
  undefined4 *puVar16;
  ulong uVar17;
  long lVar18;
  undefined4 *puVar19;
  long lVar20;
  int iVar21;
  ulong uVar22;
  ulong uVar23;
  int iVar24;
  uint uVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  ulong local_1a8;
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  ulong local_168;
  Mat local_158;
  ulong local_120;
  long local_118;
  long local_110;
  Option *local_108;
  ulong local_100;
  int local_f8;
  int local_f4;
  long local_f0;
  long local_e8;
  ulong local_e0;
  long local_d8;
  long local_d0;
  Mat *local_c8;
  Mat *local_c0;
  Mat *local_b8;
  conv_func local_b0;
  ulong local_a8;
  ulong local_a0;
  long local_98;
  long local_90;
  undefined1 local_88 [16];
  Option opt_g;
  
  uVar25 = bottom_blob->w;
  uVar7 = (ulong)uVar25;
  iVar6 = bottom_blob->h;
  _elemsize = bottom_blob->elemsize;
  uVar10 = (this->super_Convolution).kernel_w;
  local_e0 = (ulong)uVar10;
  uVar1 = (this->super_Convolution).dilation_w;
  uVar17 = (ulong)uVar1;
  iVar2 = (this->super_Convolution).stride_w;
  local_158.data = bottom_blob->data;
  local_158.refcount = bottom_blob->refcount;
  local_158.allocator = bottom_blob->allocator;
  local_158.dims = bottom_blob->dims;
  local_158.h = iVar6;
  local_158.w = uVar25;
  if (local_158.refcount != (int *)0x0) {
    LOCK();
    *local_158.refcount = *local_158.refcount + 1;
    UNLOCK();
    local_158.w = bottom_blob->w;
    local_158.h = bottom_blob->h;
  }
  iVar24 = (uVar10 - 1) * uVar1;
  local_158.c = bottom_blob->c;
  local_158.cstep = bottom_blob->cstep;
  iVar9 = (this->super_Convolution).pad_w;
  iVar21 = (this->super_Convolution).pad_h;
  local_158.elemsize = _elemsize;
  local_b0 = conv;
  if (iVar21 < 1 && iVar9 < 1) {
    if (iVar21 == -0xe9 && iVar9 == -0xe9) {
      iVar21 = iVar24 - (int)(uVar25 - 1) % iVar2;
      iVar9 = iVar24 - (iVar6 + -1) % iVar2;
      if ((0 < iVar21) || (uVar7 = (ulong)(uint)local_158.w, iVar6 = local_158.h, 0 < iVar9)) {
        copy_make_border(bottom_blob,&local_158,iVar9 / 2,iVar9 - iVar9 / 2,iVar21 / 2,
                         iVar21 - iVar21 / 2,0,0.0,opt->workspace_allocator,opt->num_threads);
        goto joined_r0x0010b8c2;
      }
    }
  }
  else {
    copy_make_border(bottom_blob,&local_158,iVar21,iVar21,iVar9,iVar9,0,0.0,opt->workspace_allocator
                     ,opt->num_threads);
joined_r0x0010b8c2:
    iVar9 = -100;
    if ((local_158.data == (void *)0x0) || (iVar9 = -100, (long)local_158.c * local_158.cstep == 0))
    goto LAB_0010b95b;
    uVar7 = (ulong)(uint)local_158.w;
    iVar6 = local_158.h;
  }
  iVar21 = ((int)uVar7 - (iVar24 + 1)) / iVar2;
  iVar15 = iVar21 + 1;
  local_100 = uVar7;
  Mat::create(top_blob,iVar15,(iVar6 - (iVar24 + 1)) / iVar2 + 1,
              (this->super_Convolution).num_output,_elemsize,opt->blob_allocator);
  iVar9 = -100;
  if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
    local_178 = (undefined1  [16])0x0;
    local_188 = (undefined1  [16])0x0;
    local_198 = (undefined1  [16])0x0;
    iVar9 = 0;
    local_168 = 0;
    local_1a8 = 0;
    local_1b8 = (undefined1  [16])0x0;
    local_1c8 = (undefined1  [16])0x0;
    local_1d8 = (undefined1  [16])0x0;
    local_c8 = top_blob;
    if (0 < (int)uVar1) {
      iVar9 = (int)local_100;
      local_f4 = uVar1 + iVar9 + -1;
      local_f8 = (uVar1 - 1) + iVar6;
      local_b8 = &(this->super_Convolution).weight_data;
      local_c0 = &(this->super_Convolution).bias_data;
      local_d0 = (long)iVar9 << 2;
      local_100 = (ulong)(iVar9 * uVar1);
      local_d8 = (long)iVar21 * 4 + 4;
      local_90 = (long)(int)(iVar15 * uVar1) << 2;
      local_110 = 0;
      local_88 = ZEXT416(3);
      local_118 = 0;
      local_120 = 0;
      local_108 = opt;
      do {
        uVar7 = (long)(local_f8 - (int)local_120) / (long)(int)uVar1;
        iVar6 = (int)uVar7;
        uVar14 = (long)(iVar6 - (int)local_e0) / (long)iVar2;
        local_a0 = uVar14 & 0xffffffff;
        uVar25 = (int)uVar14 + 1;
        local_f0 = local_110;
        local_e8 = local_118;
        uVar14 = 0;
        do {
          uVar23 = (long)(local_f4 - (int)uVar14) / (long)(int)uVar1;
          iVar15 = (int)uVar23;
          iVar24 = (iVar15 - (int)local_e0) / iVar2;
          iVar21 = bottom_blob->c;
          pAVar3 = local_108->workspace_allocator;
          auVar27._0_4_ = -(uint)(local_88._0_4_ == local_178._0_4_);
          auVar27._4_4_ = -(uint)(iVar15 == local_178._4_4_);
          auVar27._8_4_ = -(uint)(iVar6 == local_178._8_4_);
          auVar27._12_4_ = -(uint)(iVar21 == local_178._12_4_);
          iVar9 = movmskps(uVar1,auVar27);
          local_a8 = uVar14;
          if (((iVar9 != 0xf) || ((Allocator *)local_188._8_8_ != pAVar3)) ||
             (local_188._0_8_ != _elemsize)) {
            if ((int *)local_198._8_8_ != (int *)0x0) {
              LOCK();
              *(int *)local_198._8_8_ = *(int *)local_198._8_8_ + -1;
              UNLOCK();
              if (*(int *)local_198._8_8_ == 0) {
                if ((Allocator *)local_188._8_8_ == (Allocator *)0x0) {
                  if ((void *)local_198._0_8_ != (void *)0x0) {
                    free(*(void **)(local_198._0_8_ + -8));
                  }
                }
                else {
                  (**(code **)(*(long *)local_188._8_8_ + 8))();
                }
              }
            }
            local_198 = (undefined1  [16])0x0;
            local_188._8_8_ = pAVar3;
            local_188._0_8_ = _elemsize;
            local_178._4_4_ = iVar15;
            local_178._0_4_ = 3;
            local_178._8_4_ = iVar6;
            local_178._12_4_ = iVar21;
            uVar14 = (long)(iVar6 * iVar15) * _elemsize + 0xf & 0xfffffffffffffff0;
            local_168 = uVar14 / _elemsize;
            if ((long)iVar21 * local_168 != 0) {
              uVar22 = (long)iVar21 * local_168 * _elemsize + 3 & 0xfffffffffffffffc;
              if (pAVar3 == (Allocator *)0x0) {
                pvVar8 = malloc(uVar22 + 0x1c);
                local_198._0_8_ = (long)pvVar8 + 0x17U & 0xfffffffffffffff0;
                *(void **)(local_198._0_8_ - 8) = pvVar8;
              }
              else {
                local_198._0_8_ =
                     (*(code *)**(undefined8 **)pAVar3)(pAVar3,uVar22 + 4,uVar14 % _elemsize);
              }
              local_198._8_8_ = local_198._0_8_ + uVar22;
              *(undefined4 *)(local_198._0_8_ + uVar22) = 1;
              iVar21 = local_178._12_4_;
              goto LAB_0010b458;
            }
LAB_0010b8cd:
            iVar9 = -100;
            goto LAB_0010b8d2;
          }
          if ((void *)local_198._0_8_ == (void *)0x0) goto LAB_0010b8cd;
LAB_0010b458:
          iVar9 = -100;
          if ((long)iVar21 * local_168 == 0) goto LAB_0010b8d2;
          uVar10 = iVar24 + 1;
          iVar21 = (this->super_Convolution).num_output;
          pAVar3 = local_108->workspace_allocator;
          auVar26._0_4_ = -(uint)(local_88._0_4_ == local_1b8._0_4_);
          auVar26._4_4_ = -(uint)(uVar10 == local_1b8._4_4_);
          auVar26._8_4_ = -(uint)(uVar25 == local_1b8._8_4_);
          auVar26._12_4_ = -(uint)(iVar21 == local_1b8._12_4_);
          iVar11 = movmskps(uVar10,auVar26);
          if (((iVar11 == 0xf) && ((Allocator *)local_1c8._8_8_ == pAVar3)) &&
             (local_1c8._0_8_ == _elemsize)) {
            if ((void *)local_1d8._0_8_ == (void *)0x0) goto LAB_0010b8d2;
          }
          else {
            if ((int *)local_1d8._8_8_ != (int *)0x0) {
              LOCK();
              *(int *)local_1d8._8_8_ = *(int *)local_1d8._8_8_ + -1;
              UNLOCK();
              if (*(int *)local_1d8._8_8_ == 0) {
                if ((Allocator *)local_1c8._8_8_ == (Allocator *)0x0) {
                  if ((void *)local_1d8._0_8_ != (void *)0x0) {
                    free(*(void **)(local_1d8._0_8_ + -8));
                  }
                }
                else {
                  (**(code **)(*(long *)local_1c8._8_8_ + 8))();
                }
              }
            }
            local_1d8 = (undefined1  [16])0x0;
            local_1c8._8_8_ = pAVar3;
            local_1c8._0_8_ = _elemsize;
            local_1b8._4_4_ = uVar10;
            local_1b8._0_4_ = 3;
            local_1b8._8_4_ = uVar25;
            local_1b8._12_4_ = iVar21;
            uVar14 = (long)(int)(uVar25 * uVar10) * _elemsize + 0xf & 0xfffffffffffffff0;
            local_1a8 = uVar14 / _elemsize;
            if ((long)iVar21 * local_1a8 == 0) goto LAB_0010b8cd;
            uVar22 = (long)iVar21 * local_1a8 * _elemsize + 3 & 0xfffffffffffffffc;
            if (pAVar3 == (Allocator *)0x0) {
              pvVar8 = malloc(uVar22 + 0x1c);
              local_1d8._0_8_ = (long)pvVar8 + 0x17U & 0xfffffffffffffff0;
              *(void **)(local_1d8._0_8_ - 8) = pvVar8;
            }
            else {
              local_1d8._0_8_ =
                   (*(code *)**(undefined8 **)pAVar3)(pAVar3,uVar22 + 4,uVar14 % _elemsize);
            }
            local_1d8._8_8_ = local_1d8._0_8_ + uVar22;
            *(undefined4 *)(local_1d8._0_8_ + uVar22) = 1;
            iVar21 = local_1b8._12_4_;
          }
          iVar9 = -100;
          if ((long)iVar21 * local_1a8 == 0) goto LAB_0010b8d2;
          iVar9 = bottom_blob->c;
          if (0 < (long)iVar9) {
            lVar18 = (long)local_158.data + local_e8;
            local_98 = local_158.cstep * local_158.elemsize;
            lVar20 = 0;
            pvVar8 = (void *)local_198._0_8_;
            do {
              if (0 < iVar6) {
                iVar21 = 0;
                uVar14 = 0;
                pvVar12 = pvVar8;
                do {
                  if (0 < iVar15) {
                    puVar13 = (undefined4 *)(lVar18 + (long)iVar21 * 4);
                    uVar22 = 0;
                    do {
                      *(undefined4 *)((long)pvVar12 + uVar22 * 4) = *puVar13;
                      uVar22 = uVar22 + 1;
                      puVar13 = puVar13 + uVar17;
                    } while ((uVar23 & 0xffffffff) != uVar22);
                  }
                  uVar14 = uVar14 + 1;
                  iVar21 = iVar21 + (int)local_100;
                  pvVar12 = (void *)((long)pvVar12 + (long)iVar15 * 4);
                } while (uVar14 != (uVar7 & 0xffffffff));
              }
              lVar20 = lVar20 + 1;
              lVar18 = lVar18 + local_98;
              pvVar8 = (void *)((long)pvVar8 + local_168 * local_188._0_8_);
            } while (lVar20 != iVar9);
          }
          opt_g.lightmode = local_108->lightmode;
          opt_g._1_3_ = *(undefined3 *)&local_108->field_0x1;
          opt_g.num_threads = local_108->num_threads;
          opt_g.workspace_allocator = local_108->workspace_allocator;
          opt_g.blob_allocator = (Allocator *)local_1c8._8_8_;
          (*local_b0)((Mat *)local_198,(Mat *)local_1d8,local_b8,local_c0,&opt_g);
          lVar18 = (long)(this->super_Convolution).num_output;
          if (0 < lVar18) {
            sVar4 = local_c8->cstep;
            puVar13 = (undefined4 *)((long)local_c8->data + local_f0);
            sVar5 = local_c8->elemsize;
            lVar20 = 0;
            pvVar8 = (void *)local_1d8._0_8_;
            do {
              if (-1 < (int)local_a0) {
                uVar14 = 0;
                puVar19 = puVar13;
                pvVar12 = pvVar8;
                do {
                  if (-1 < iVar24) {
                    uVar23 = 0;
                    puVar16 = puVar19;
                    do {
                      *puVar16 = *(undefined4 *)((long)pvVar12 + uVar23 * 4);
                      uVar23 = uVar23 + 1;
                      puVar16 = puVar16 + uVar17;
                    } while (uVar10 != uVar23);
                  }
                  uVar14 = uVar14 + 1;
                  puVar19 = (undefined4 *)((long)puVar19 + local_90);
                  pvVar12 = (void *)((long)pvVar12 + (long)(int)uVar10 * 4);
                } while (uVar14 != uVar25);
              }
              lVar20 = lVar20 + 1;
              puVar13 = (undefined4 *)((long)puVar13 + sVar4 * sVar5);
              pvVar8 = (void *)((long)pvVar8 + local_1a8 * local_1c8._0_8_);
            } while (lVar20 != lVar18);
          }
          uVar14 = local_a8 + 1;
          local_e8 = local_e8 + 4;
          local_f0 = local_f0 + 4;
        } while (uVar14 != uVar17);
        local_120 = local_120 + 1;
        local_118 = local_118 + local_d0;
        local_110 = local_110 + local_d8;
        iVar9 = 0;
      } while (local_120 != uVar17);
    }
LAB_0010b8d2:
    if ((int *)local_1d8._8_8_ != (int *)0x0) {
      LOCK();
      *(int *)local_1d8._8_8_ = *(int *)local_1d8._8_8_ + -1;
      UNLOCK();
      if (*(int *)local_1d8._8_8_ == 0) {
        if ((Allocator *)local_1c8._8_8_ == (Allocator *)0x0) {
          if ((void *)local_1d8._0_8_ != (void *)0x0) {
            free(*(void **)(local_1d8._0_8_ + -8));
          }
        }
        else {
          (**(code **)(*(long *)local_1c8._8_8_ + 8))();
        }
      }
    }
    if ((int *)local_198._8_8_ != (int *)0x0) {
      LOCK();
      *(int *)local_198._8_8_ = *(int *)local_198._8_8_ + -1;
      UNLOCK();
      if (*(int *)local_198._8_8_ == 0) {
        if ((Allocator *)local_188._8_8_ == (Allocator *)0x0) {
          if ((void *)local_198._0_8_ != (void *)0x0) {
            free(*(void **)(local_198._0_8_ + -8));
          }
        }
        else {
          (**(code **)(*(long *)local_188._8_8_ + 8))();
        }
      }
    }
  }
LAB_0010b95b:
  if (local_158.refcount != (int *)0x0) {
    LOCK();
    *local_158.refcount = *local_158.refcount + -1;
    UNLOCK();
    if (*local_158.refcount == 0) {
      if (local_158.allocator == (Allocator *)0x0) {
        if (local_158.data != (void *)0x0) {
          free(*(void **)((long)local_158.data + -8));
        }
      }
      else {
        (**(code **)(*(long *)local_158.allocator + 8))();
      }
    }
  }
  return iVar9;
}

Assistant:

int Convolution_x86::forwardDilation(const Mat& bottom_blob, Mat& top_blob, conv_func conv, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    size_t elemsize = bottom_blob.elemsize;

    const int kernel_size = kernel_w;
    const int stride = stride_w;
    const int dilation = dilation_w;
    const int kernel_extent = dilation * (kernel_size - 1) + 1;

    Mat bottom_blob_bordered = bottom_blob;
    if (pad_w > 0 || pad_h > 0)
    {
        copy_make_border(bottom_blob, bottom_blob_bordered, pad_h, pad_h, pad_w, pad_w, BORDER_CONSTANT, 0.f, opt.workspace_allocator, opt.num_threads);
        if (bottom_blob_bordered.empty())
            return -100;

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;
    }
    else if (pad_w == -233 && pad_h == -233)
    {
        int wpad = kernel_extent + (w - 1) / stride * stride - w;
        int hpad = kernel_extent + (h - 1) / stride * stride - h;
        if (wpad > 0 || hpad > 0)
        {
            copy_make_border(bottom_blob, bottom_blob_bordered, hpad / 2, hpad - hpad / 2, wpad / 2, wpad - wpad / 2, BORDER_CONSTANT, 0.f, opt.workspace_allocator, opt.num_threads);
            if (bottom_blob_bordered.empty())
                return -100;
        }

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;
    }

    int outw = (w - kernel_extent) / stride + 1;
    int outh = (h - kernel_extent) / stride + 1;

    top_blob.create(outw, outh, num_output, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // Make (dilation * dilation) batches
    Mat inner_bottom_blob;
    Mat inner_top_blob;
    for (int x = 0; x < dilation; x ++)
    {
        for (int y = 0; y < dilation; y ++)
        {
            int inner_w = (w - y + dilation - 1) / dilation;
            int inner_h = (h - x + dilation - 1) / dilation;

            int inner_outw = (inner_w - kernel_size) / stride + 1;
            int inner_outh = (inner_h - kernel_size) / stride + 1;

            inner_bottom_blob.create(inner_w, inner_h, bottom_blob.c, elemsize, opt.workspace_allocator);
            if (inner_bottom_blob.empty())
                return -100;

            inner_top_blob.create(inner_outw, inner_outh, num_output, elemsize, opt.workspace_allocator);
            if (inner_top_blob.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int c = 0; c < bottom_blob.c; c ++)
            {
                float *outptr = inner_bottom_blob.channel(c);

                for (int i = 0; i < inner_h; i ++)
                {
                    const float* ptr = (const float *)bottom_blob_bordered.channel(c) + dilation * i * w + x * w + y;
                    for (int j = 0; j < inner_w; j ++)
                    {
                        outptr[j] = ptr[j*dilation];
                    }
                    outptr += inner_w;
                }
            }

            ncnn::Option opt_g = opt;
            opt_g.blob_allocator = inner_top_blob.allocator;
            conv(inner_bottom_blob, inner_top_blob, weight_data, bias_data, opt_g);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int c = 0; c < num_output; c ++)
            {
                float *outptr = (float *)top_blob.channel(c) + x * outw + y;
                for (int i = 0; i < inner_outh; i ++)
                {
                    const float* ptr = (const float *)inner_top_blob.channel(c) + i * inner_outw;
                    for (int j = 0; j < inner_outw; j ++)
                    {
                        outptr[j*dilation] = ptr[j];
                    }
                    outptr += dilation * outw;
                }
            }
        }
    }

    return 0;
}